

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O3

void __thiscall
btSoftRigidDynamicsWorld::addSoftBody
          (btSoftRigidDynamicsWorld *this,btSoftBody *body,short collisionFilterGroup,
          short collisionFilterMask)

{
  btSoftBody **ptr;
  uint uVar1;
  btSoftBody **ppbVar2;
  ulong uVar3;
  int iVar4;
  
  uVar1 = (this->m_softBodies).m_size;
  if (uVar1 == (this->m_softBodies).m_capacity) {
    iVar4 = 1;
    if (uVar1 != 0) {
      iVar4 = uVar1 * 2;
    }
    if ((int)uVar1 < iVar4) {
      if (iVar4 == 0) {
        ppbVar2 = (btSoftBody **)0x0;
      }
      else {
        ppbVar2 = (btSoftBody **)btAlignedAllocInternal((long)iVar4 << 3,0x10);
        uVar1 = (this->m_softBodies).m_size;
      }
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          ppbVar2[uVar3] = (this->m_softBodies).m_data[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      ptr = (this->m_softBodies).m_data;
      if ((ptr != (btSoftBody **)0x0) && ((this->m_softBodies).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
        uVar1 = (this->m_softBodies).m_size;
      }
      (this->m_softBodies).m_ownsMemory = true;
      (this->m_softBodies).m_data = ppbVar2;
      (this->m_softBodies).m_capacity = iVar4;
    }
  }
  (this->m_softBodies).m_data[(int)uVar1] = body;
  (this->m_softBodies).m_size = uVar1 + 1;
  body->m_softBodySolver = this->m_softBodySolver;
  btCollisionWorld::addCollisionObject
            ((btCollisionWorld *)this,&body->super_btCollisionObject,collisionFilterGroup,
             collisionFilterMask);
  return;
}

Assistant:

void	btSoftRigidDynamicsWorld::addSoftBody(btSoftBody* body,short int collisionFilterGroup,short int collisionFilterMask)
{
	m_softBodies.push_back(body);

	// Set the soft body solver that will deal with this body
	// to be the world's solver
	body->setSoftBodySolver( m_softBodySolver );

	btCollisionWorld::addCollisionObject(body,
		collisionFilterGroup,
		collisionFilterMask);

}